

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *brand)

{
  ListElementCount LVar1;
  ushort uVar2;
  ElementCount index;
  ElementCount index_00;
  bool isPointer;
  ElementCount local_154;
  Validator *local_150;
  Reader binding;
  DebugExpression<bool_&> _kjCondition;
  Reader scope;
  Fault f;
  Reader type;
  ListReader local_90;
  ListReader local_60;
  
  if ((brand->_reader).pointerCount == 0) {
    scope._reader.pointers._0_4_ = 0x7fffffff;
    scope._reader.capTable = (CapTableReader *)0x0;
    scope._reader.data = (WirePointer *)0x0;
    scope._reader.segment = (SegmentReader *)0x0;
  }
  else {
    scope._reader.segment = (brand->_reader).segment;
    scope._reader.capTable = (brand->_reader).capTable;
    scope._reader.data = (brand->_reader).pointers;
    scope._reader.pointers._0_4_ = (brand->_reader).nestingLimit;
  }
  index = 0;
  local_150 = this;
  _::PointerReader::getList(&local_60,(PointerReader *)&scope,INLINE_COMPOSITE,(word *)0x0);
  local_154 = local_60.elementCount;
  if (local_60.elementCount != 0) {
    do {
      _::ListReader::getStructElement(&scope._reader,&local_60,index);
      if ((scope._reader.dataSize < 0x50) || (*(short *)((long)scope._reader.data + 8) == 0)) {
        if (scope._reader.pointerCount == 0) {
          binding._reader.pointers._0_4_ = 0x7fffffff;
          binding._reader.capTable = (CapTableReader *)0x0;
          binding._reader.data = (void *)0x0;
          binding._reader.segment = (SegmentReader *)0x0;
        }
        else {
          binding._reader.data =
               (void *)CONCAT44(scope._reader.pointers._4_4_,(int)scope._reader.pointers);
          binding._reader.capTable = scope._reader.capTable;
          binding._reader.segment = scope._reader.segment;
          binding._reader.pointers._0_4_ = scope._reader.nestingLimit;
        }
        _::PointerReader::getList
                  (&local_90,(PointerReader *)&binding._reader,INLINE_COMPOSITE,(word *)0x0);
        LVar1 = local_90.elementCount;
        if (local_90.elementCount != 0) {
          index_00 = 0;
          do {
            _::ListReader::getStructElement(&binding._reader,&local_90,index_00);
            if ((0xf < binding._reader.dataSize) && (*binding._reader.data == 1)) {
              _kjCondition.value = (bool *)binding._reader.segment;
              if (binding._reader.pointerCount == 0) {
                _kjCondition.value = (bool *)(SegmentReader *)0x0;
              }
              uVar2 = 0;
              _::PointerReader::getStruct(&type._reader,(PointerReader *)&_kjCondition,(word *)0x0);
              validate(local_150,(Reader *)&type._reader);
              isPointer = true;
              if (0xf < type._reader.dataSize) {
                uVar2 = *type._reader.data;
              }
              if (uVar2 < 0x13) {
                if ((0x8fffU >> (uVar2 & 0x1f) & 1) == 0) {
                  isPointer = true;
                }
                else {
                  isPointer = false;
                }
              }
              _kjCondition.value = &isPointer;
              if (isPointer == false) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[46],capnp::schema::Type::Reader&>
                          (&f,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                           ,0x24d,FAILED,"isPointer",
                           "_kjCondition,\"generic type parameter must be a pointer type\", type",
                           &_kjCondition,
                           (char (*) [46])"generic type parameter must be a pointer type",&type);
                local_150->isValid = false;
                kj::_::Debug::Fault::~Fault(&f);
                return;
              }
            }
            index_00 = index_00 + 1;
          } while (LVar1 != index_00);
        }
      }
      index = index + 1;
    } while (index != local_154);
  }
  return;
}

Assistant:

void validate(const schema::Brand::Reader& brand) {
    for (auto scope: brand.getScopes()) {
      switch (scope.which()) {
        case schema::Brand::Scope::BIND:
          for (auto binding: scope.getBind()) {
            switch (binding.which()) {
              case schema::Brand::Binding::UNBOUND:
                break;
              case schema::Brand::Binding::TYPE: {
                auto type = binding.getType();
                validate(type);
                bool isPointer = true;
                switch (type.which()) {
                  case schema::Type::VOID:
                  case schema::Type::BOOL:
                  case schema::Type::INT8:
                  case schema::Type::INT16:
                  case schema::Type::INT32:
                  case schema::Type::INT64:
                  case schema::Type::UINT8:
                  case schema::Type::UINT16:
                  case schema::Type::UINT32:
                  case schema::Type::UINT64:
                  case schema::Type::FLOAT32:
                  case schema::Type::FLOAT64:
                  case schema::Type::ENUM:
                    isPointer = false;
                    break;

                  case schema::Type::TEXT:
                  case schema::Type::DATA:
                  case schema::Type::ANY_POINTER:
                  case schema::Type::STRUCT:
                  case schema::Type::INTERFACE:
                  case schema::Type::LIST:
                    isPointer = true;
                    break;
                }
                VALIDATE_SCHEMA(isPointer,
                    "generic type parameter must be a pointer type", type);

                break;
              }
            }
          }
          break;
        case schema::Brand::Scope::INHERIT:
          break;
      }
    }
  }